

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O3

void dg::dda::recGatherNonPhisDefs
               (RWNode *phi,SparseBitvectorHashImpl *phis,SparseBitvectorHashImpl *ret,
               bool intraproc)

{
  uint uVar1;
  ulong uVar2;
  pointer ppRVar3;
  RWNode *phi_00;
  mapped_type *pmVar4;
  pointer ppRVar5;
  ulong uVar6;
  unsigned_long sft;
  ulong local_48;
  uint local_3c;
  SparseBitvectorHashImpl *local_38;
  
  uVar1 = (phi->super_SubgraphNode<dg::dda::RWNode>).id;
  local_48 = (ulong)(uVar1 & 0xffffffc0);
  local_38 = phis;
  pmVar4 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)phis,&local_48);
  uVar2 = *pmVar4;
  uVar6 = (ulong)(uVar1 - (int)local_48);
  *pmVar4 = uVar2 | 1L << (uVar6 & 0x3f);
  if ((uVar2 >> (uVar6 & 0x3f) & 1) == 0) {
    ppRVar5 = (phi->defuse).defuse.
              super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppRVar3 = (phi->defuse).defuse.
              super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppRVar5 != ppRVar3) {
      local_3c = (uint)intraproc;
      do {
        phi_00 = *ppRVar5;
        if ((4 < phi_00->type - PHI) || ((intraproc && (phi_00->type - INARG < 4)))) {
          uVar1 = (phi_00->super_SubgraphNode<dg::dda::RWNode>).id;
          local_48 = (ulong)(uVar1 & 0xffffffc0);
          pmVar4 = std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)ret,&local_48);
          *pmVar4 = *pmVar4 | 1L << ((char)uVar1 - (char)local_48 & 0x3fU);
        }
        else {
          recGatherNonPhisDefs(phi_00,local_38,ret,SUB41(local_3c,0));
        }
        ppRVar5 = ppRVar5 + 1;
      } while (ppRVar5 != ppRVar3);
    }
  }
  return;
}

Assistant:

static void recGatherNonPhisDefs(RWNode *phi,
                                 dg::ADT::SparseBitvectorHashImpl &phis,
                                 dg::ADT::SparseBitvectorHashImpl &ret,
                                 bool intraproc = false) {
    assert(phi->isPhi());
    // set returns the previous value, so if its 'true',
    // we already had the phi
    if (phis.set(phi->getID()))
        return; // we already visited this phi

    for (auto *n : phi->defuse) {
        if (!n->isPhi()) {
            ret.set(n->getID());
        } else {
            if (intraproc && n->isInOut()) {
                ret.set(n->getID());
            } else {
                recGatherNonPhisDefs(n, phis, ret, intraproc);
            }
        }
    }
}